

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void compact_float64_suite::fail_array16_float64_missing_two(void)

{
  value_type input [9];
  decoder decoder;
  undefined4 local_48;
  value local_44;
  uchar local_40 [16];
  decoder local_30;
  
  local_40[8] = '\0';
  local_40[0] = 0xbf;
  local_40[1] = '\b';
  local_40[2] = '\0';
  local_40[3] = '\0';
  local_40[4] = '\0';
  local_40[5] = '\0';
  local_40[6] = '\0';
  local_40[7] = '\0';
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[9]>
            (&local_30,(uchar (*) [9])local_40);
  local_44 = local_30.current.code;
  local_48 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xf99,"void compact_float64_suite::fail_array16_float64_missing_two()",&local_44,
             &local_48);
  return;
}

Assistant:

void fail_array16_float64_missing_two()
{
    const value_type input[] = { token::code::array16_float64, 0x08, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}